

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  int32_t index;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m128i *palVar18;
  __m128i *ptr;
  __m128i *b;
  __m128i *ptr_00;
  __m128i *b_00;
  __m128i *ptr_01;
  __m128i *palVar19;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int32_t *ptr_04;
  ulong uVar20;
  uint uVar21;
  __m128i *palVar22;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  __m128i *palVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ulong uVar47;
  undefined1 auVar46 [16];
  uint uVar48;
  int iVar49;
  uint uVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  uint uVar58;
  int iVar59;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int32_t iVar60;
  uint uVar61;
  uint uVar62;
  uint uVar67;
  uint uVar69;
  undefined1 auVar63 [16];
  uint uVar71;
  undefined1 auVar64 [16];
  uint uVar68;
  uint uVar70;
  uint uVar72;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar73;
  uint uVar77;
  uint uVar78;
  undefined1 auVar74 [16];
  uint uVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  __m128i alVar88;
  undefined1 auVar89 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ulong uVar92;
  undefined1 in_XMM8 [16];
  undefined1 auVar93 [16];
  int iVar94;
  int iVar96;
  int iVar97;
  undefined1 auVar95 [16];
  int iVar98;
  int iVar101;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int iVar102;
  int iVar105;
  int iVar106;
  int iVar107;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int iVar108;
  undefined1 auVar109 [16];
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  uint local_248;
  int local_244;
  __m128i *local_230;
  __m128i *local_218;
  __m128i *local_210;
  __m128i *local_208;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [16];
  ulong local_148;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  size_t len;
  longlong extraout_RDX_00;
  long lVar57;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_table_striped_profile_sse41_128_32_cold_1();
        }
        else {
          uVar12 = uVar4 - 1;
          uVar31 = (ulong)uVar4 + 3;
          uVar33 = uVar31 >> 2;
          uVar36 = (ulong)uVar12 % uVar33;
          iVar16 = (int)(uVar12 / uVar33);
          uVar30 = -open;
          uVar13 = ppVar6->min;
          uVar14 = 0x80000000 - uVar13;
          if (uVar13 != uVar30 && SBORROW4(uVar13,uVar30) == (int)(uVar13 + open) < 0) {
            uVar14 = open | 0x80000000;
          }
          pvVar7 = (profile->profile32).matches;
          uVar13 = 0x7ffffffe - ppVar6->max;
          pvVar8 = (profile->profile32).similar;
          ppVar17 = parasail_result_new_table3((uint)uVar31 & 0x7ffffffc,s2Len);
          if (ppVar17 != (parasail_result_t *)0x0) {
            ppVar17->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar17->flag | 0x4430802;
            palVar18 = parasail_memalign___m128i(0x10,uVar33);
            ptr = parasail_memalign___m128i(0x10,uVar33);
            b = parasail_memalign___m128i(0x10,uVar33);
            ptr_00 = parasail_memalign___m128i(0x10,uVar33);
            b_00 = parasail_memalign___m128i(0x10,uVar33);
            ptr_01 = parasail_memalign___m128i(0x10,uVar33);
            palVar19 = parasail_memalign___m128i(0x10,uVar33);
            ptr_02 = parasail_memalign___m128i(0x10,uVar33);
            ptr_03 = parasail_memalign___m128i(0x10,uVar33);
            b_01 = parasail_memalign___m128i(0x10,uVar33);
            b_02 = parasail_memalign___m128i(0x10,uVar33);
            b_03 = parasail_memalign___m128i(0x10,uVar33);
            ptr_04 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            auVar80 = (undefined1  [16])0x0;
            c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            c[1]._0_1_ = b_02 == (__m128i *)0x0;
            auVar37._0_8_ = -(ulong)(palVar18 == (__m128i *)0x0);
            auVar37._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar63._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar63._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
            auVar37 = packssdw(auVar37,auVar63);
            auVar85._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar85._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
            auVar90._0_8_ = -(ulong)(palVar19 == (__m128i *)0x0);
            auVar90._8_8_ = -(ulong)(ptr_02 == (__m128i *)0x0);
            auVar63 = packssdw(auVar85,auVar90);
            auVar37 = packssdw(auVar37,auVar63);
            if (((((b_01 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) && b_02 != (__m128i *)0x0)
                 && b_03 != (__m128i *)0x0) && ptr_04 != (int32_t *)0x0) &&
                ((((((((((((((((auVar37 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar37 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar37 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar37 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar37 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar37 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar37 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar37 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar37 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar37 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar37 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar37 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar37[0xf])) {
              iVar1 = s2Len + -1;
              uVar21 = 3 - iVar16;
              len = (size_t)uVar21;
              uVar14 = uVar14 + 1;
              c[0] = uVar33;
              parasail_memset___m128i(b,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = uVar33;
              parasail_memset___m128i(b_00,c_00,len);
              c_01[1] = extraout_RDX_01;
              c_01[0] = uVar33;
              parasail_memset___m128i(palVar19,c_01,len);
              c_02[1] = extraout_RDX_02;
              c_02[0] = uVar33;
              parasail_memset___m128i(b_01,c_02,len);
              c_03[1] = extraout_RDX_03;
              c_03[0] = uVar33;
              parasail_memset___m128i(b_02,c_03,len);
              c_04[1] = extraout_RDX_04;
              c_04[0] = uVar33;
              parasail_memset___m128i(b_03,c_04,len);
              auVar100._4_4_ = uVar30;
              auVar100._0_4_ = uVar30;
              auVar100._8_4_ = uVar30;
              auVar100._12_4_ = uVar30;
              local_148 = CONCAT44(0,open);
              auVar109._8_4_ = open;
              auVar109._0_8_ = local_148;
              auVar109._12_4_ = 0;
              uVar35 = (uint)uVar33;
              auVar74._8_4_ = uVar35;
              auVar74._0_8_ = uVar33;
              auVar74._12_4_ = 0;
              auVar37 = pmovsxbq(auVar80,0x302);
              auVar63 = pmuldq(auVar37,auVar74);
              auVar37 = pmuldq(auVar74,_DAT_00903a90);
              uVar20 = 0;
              auVar85 = pmovsxdq(in_XMM5,0x8000000080000000);
              palVar22 = palVar18;
              palVar23 = ptr_03;
              do {
                if (s1_beg == 0) {
                  auVar38._8_4_ = (int)uVar20;
                  auVar38._0_8_ = uVar20;
                  auVar38._12_4_ = (int)(uVar20 >> 0x20);
                  auVar39._0_4_ = (undefined4)(uVar20 + auVar37._0_8_);
                  auVar39._4_4_ = (int)(auVar38._8_8_ + auVar37._8_8_);
                  auVar39._8_4_ = (int)(auVar63._0_8_ + uVar20);
                  auVar39._12_4_ = (int)(auVar63._8_8_ + auVar38._8_8_);
                  auVar80._4_4_ = gap;
                  auVar80._0_4_ = gap;
                  auVar80._8_4_ = gap;
                  auVar80._12_4_ = gap;
                  auVar90 = pmulld(auVar39,auVar80);
                  alVar88[0]._0_4_ = uVar30 - auVar90._0_4_;
                  alVar88[0]._4_4_ = uVar30 - auVar90._4_4_;
                  alVar88[1]._0_4_ = uVar30 - auVar90._8_4_;
                  alVar88[1]._4_4_ = uVar30 - auVar90._12_4_;
                }
                else {
                  alVar88[0] = 0;
                  alVar88[1] = 0;
                }
                auVar90 = pmovsxdq(in_XMM7,(undefined1  [16])alVar88);
                auVar40._0_8_ = alVar88[1];
                auVar40._8_4_ = (int)alVar88[1];
                auVar40._12_4_ = alVar88[1]._4_4_;
                auVar80 = pmovsxdq(in_XMM8,auVar40);
                in_XMM8._0_8_ = auVar80._0_8_ - local_148;
                in_XMM8._8_8_ = auVar80._8_8_ - (ulong)(uint)open;
                auVar91._0_8_ = auVar90._0_8_ - local_148;
                auVar91._8_8_ = auVar90._8_8_ - (ulong)(uint)open;
                auVar41._0_8_ = -(ulong)(auVar85._0_8_ < auVar91._0_8_);
                auVar41._8_8_ = -(ulong)(auVar85._8_8_ < auVar91._8_8_);
                auVar90 = blendvpd(auVar85,auVar91,auVar41);
                auVar42._0_8_ = -(ulong)(auVar85._0_8_ < in_XMM8._0_8_);
                auVar42._8_8_ = -(ulong)(auVar85._8_8_ < in_XMM8._8_8_);
                in_XMM7 = blendvpd(auVar85,in_XMM8,auVar42);
                *palVar22 = alVar88;
                *(int *)*palVar23 = auVar90._0_4_;
                *(int *)((long)*palVar23 + 4) = auVar90._8_4_;
                *(int *)(*palVar23 + 1) = in_XMM7._0_4_;
                *(int *)((long)*palVar23 + 0xc) = in_XMM7._8_4_;
                uVar20 = uVar20 + 1;
                palVar23 = palVar23 + 1;
                palVar22 = palVar22 + 1;
              } while (uVar33 != uVar20);
              *ptr_04 = 0;
              uVar47 = (ulong)(uint)s2Len;
              auVar37 = pmovsxbq(auVar100,0x302);
              auVar63 = pmovsxbq(auVar109,0x100);
              uVar20 = (ulong)DAT_00906ca0;
              auVar76._8_8_ = uVar47 - 1 ^ uVar20;
              auVar52._8_8_ = 0;
              uVar27 = uVar30;
              do {
                if ((bool)(~((long)auVar76._8_8_ < (long)(auVar52._8_8_ ^ uVar20)) & 1)) {
                  uVar62 = 0;
                  if (s2_beg == 0) {
                    uVar62 = uVar27;
                  }
                  ptr_04[auVar52._8_8_ + 1] = uVar62;
                }
                if ((long)((auVar52._8_8_ | auVar63._0_8_) ^ uVar20) <= (long)auVar76._8_8_) {
                  iVar15 = uVar27 - gap;
                  if (s2_beg != 0) {
                    iVar15 = 0;
                  }
                  ptr_04[auVar52._8_8_ + 2] = iVar15;
                }
                bVar10 = (long)((auVar52._8_8_ | auVar37._0_8_) ^ uVar20) <= (long)auVar76._8_8_;
                if (bVar10) {
                  iVar15 = gap * -2 + uVar27;
                  if (s2_beg != 0) {
                    iVar15 = 0;
                  }
                  ptr_04[auVar52._8_8_ + 3] = iVar15;
                }
                if (bVar10) {
                  iVar15 = gap * -3 + uVar27;
                  if (s2_beg != 0) {
                    iVar15 = 0;
                  }
                  ptr_04[auVar52._8_8_ + 4] = iVar15;
                }
                auVar52._8_8_ = auVar52._8_8_ + 4;
                uVar27 = uVar27 + gap * -4;
              } while ((s2Len + 3U & 0xfffffffc) != auVar52._8_8_);
              uVar27 = uVar35 - 1;
              lVar28 = uVar33 * uVar47;
              lVar57 = lVar28 * 4;
              lVar29 = lVar28 * 8;
              lVar28 = lVar28 * 0xc;
              lVar25 = 0;
              uVar20 = 0;
              auVar52._4_4_ = uVar14;
              auVar52._0_4_ = uVar14;
              auVar52._8_4_ = uVar14;
              auVar52._12_4_ = uVar14;
              auVar37 = auVar52;
              auVar76 = auVar52;
              auVar84 = auVar52;
              auVar86 = auVar52;
              local_1e8 = uVar13;
              uStack_1e4 = uVar13;
              uStack_1e0 = uVar13;
              uStack_1dc = uVar13;
              local_244 = iVar1;
              do {
                local_208 = ptr_00;
                local_210 = ptr_02;
                local_218 = ptr_01;
                local_230 = ptr;
                ptr_01 = b_00;
                ptr_00 = b;
                ptr_02 = palVar19;
                ptr = palVar18;
                palVar18 = ptr + uVar27;
                palVar19 = ptr_00 + uVar27;
                iVar98 = (int)(*palVar19)[0];
                iVar108 = *(int *)((long)*palVar19 + 4);
                iVar101 = (int)(*palVar19)[1];
                palVar19 = ptr_01 + uVar27;
                iVar105 = (int)(*palVar19)[0];
                iVar106 = *(int *)((long)*palVar19 + 4);
                iVar107 = (int)(*palVar19)[1];
                palVar19 = ptr_02 + uVar27;
                iVar54 = (int)(*palVar19)[0];
                iVar56 = *(int *)((long)*palVar19 + 4);
                iVar59 = (int)(*palVar19)[1];
                iVar97 = 0;
                iVar102 = 0;
                iVar49 = 0;
                palVar19 = ptr + uVar27;
                iVar15 = (int)(*palVar19)[0];
                iVar94 = *(int *)((long)*palVar19 + 4);
                iVar96 = (int)(*palVar19)[1];
                iVar60 = ptr_04[uVar20];
                lVar26 = (long)ppVar6->mapper[(byte)s2[uVar20]] * uVar33 * 0x10;
                local_1d8 = (undefined1  [16])0x0;
                lVar32 = 0;
                auVar93 = ZEXT816(0);
                lVar24 = lVar25;
                auVar82 = _DAT_00905160;
                uVar62 = uVar14;
                uVar68 = uVar14;
                uVar70 = uVar14;
                uVar72 = uVar14;
                do {
                  piVar2 = (int *)((long)*ptr_03 + lVar32);
                  iVar110 = *piVar2;
                  iVar111 = piVar2[1];
                  iVar112 = piVar2[2];
                  iVar113 = piVar2[3];
                  auVar63 = *(undefined1 (*) [16])((long)*b_01 + lVar32);
                  auVar85 = *(undefined1 (*) [16])((long)*b_02 + lVar32);
                  auVar90 = *(undefined1 (*) [16])((long)*b_03 + lVar32);
                  piVar2 = (int *)((long)pvVar5 + lVar32 + lVar26);
                  uVar61 = iVar60 + *piVar2;
                  uVar67 = iVar15 + piVar2[1];
                  uVar69 = iVar94 + piVar2[2];
                  uVar71 = iVar96 + piVar2[3];
                  uVar73 = (uint)((int)uVar61 < iVar110) * iVar110 |
                           ((int)uVar61 >= iVar110) * uVar61;
                  uVar77 = (uint)((int)uVar67 < iVar111) * iVar111 |
                           ((int)uVar67 >= iVar111) * uVar67;
                  uVar78 = (uint)((int)uVar69 < iVar112) * iVar112 |
                           ((int)uVar69 >= iVar112) * uVar69;
                  uVar79 = (uint)((int)uVar71 < iVar113) * iVar113 |
                           ((int)uVar71 >= iVar113) * uVar71;
                  uVar48 = ((int)uVar73 < (int)uVar62) * uVar62 |
                           ((int)uVar73 >= (int)uVar62) * uVar73;
                  uVar53 = ((int)uVar77 < (int)uVar68) * uVar68 |
                           ((int)uVar77 >= (int)uVar68) * uVar77;
                  uVar55 = ((int)uVar78 < (int)uVar70) * uVar70 |
                           ((int)uVar78 >= (int)uVar70) * uVar78;
                  uVar58 = ((int)uVar79 < (int)uVar72) * uVar72 |
                           ((int)uVar79 >= (int)uVar72) * uVar79;
                  puVar3 = (uint *)((long)*local_230 + lVar32);
                  *puVar3 = uVar48;
                  puVar3[1] = uVar53;
                  puVar3[2] = uVar55;
                  puVar3[3] = uVar58;
                  auVar75._0_4_ = -(uint)((int)uVar62 < (int)uVar73);
                  auVar75._4_4_ = -(uint)((int)uVar68 < (int)uVar77);
                  auVar75._8_4_ = -(uint)((int)uVar70 < (int)uVar78);
                  auVar75._12_4_ = -(uint)((int)uVar72 < (int)uVar79);
                  auVar80 = blendvps(auVar93,auVar63,auVar75);
                  piVar2 = (int *)((long)pvVar7 + lVar32 + lVar26);
                  auVar99._0_4_ = iVar97 + *piVar2;
                  auVar99._4_4_ = iVar98 + piVar2[1];
                  auVar99._8_4_ = iVar108 + piVar2[2];
                  auVar99._12_4_ = iVar101 + piVar2[3];
                  auVar64._0_4_ = -(uint)(uVar61 == uVar48);
                  auVar64._4_4_ = -(uint)(uVar67 == uVar53);
                  auVar64._8_4_ = -(uint)(uVar69 == uVar55);
                  auVar64._12_4_ = -(uint)(uVar71 == uVar58);
                  auVar109 = blendvps(auVar80,auVar99,auVar64);
                  *(undefined1 (*) [16])((long)*local_208 + lVar32) = auVar109;
                  auVar80 = blendvps(local_1d8,auVar85,auVar75);
                  piVar2 = (int *)((long)pvVar8 + lVar32 + lVar26);
                  auVar103._0_4_ = iVar102 + *piVar2;
                  auVar103._4_4_ = iVar105 + piVar2[1];
                  auVar103._8_4_ = iVar106 + piVar2[2];
                  auVar103._12_4_ = iVar107 + piVar2[3];
                  auVar100 = blendvps(auVar80,auVar103,auVar64);
                  *(undefined1 (*) [16])((long)*local_218 + lVar32) = auVar100;
                  auVar80 = blendvps(auVar82,auVar90,auVar75);
                  auVar95._0_4_ = iVar49 + 1;
                  auVar95._4_4_ = iVar54 + 1;
                  auVar95._8_4_ = iVar56 + 1;
                  auVar95._12_4_ = iVar59 + 1;
                  auVar80 = blendvps(auVar80,auVar95,auVar64);
                  *(undefined1 (*) [16])((long)*local_210 + lVar32) = auVar80;
                  lVar34 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 8);
                  iVar108 = auVar109._0_4_;
                  *(int *)(lVar34 + lVar24) = iVar108;
                  lVar34 = lVar34 + lVar24;
                  uVar9 = extractps(auVar109,1);
                  *(undefined8 *)(lVar57 + lVar34) = uVar9;
                  uVar9 = extractps(auVar109,2);
                  *(undefined8 *)(lVar29 + lVar34) = uVar9;
                  uVar9 = extractps(auVar109,3);
                  *(undefined8 *)(lVar28 + lVar34) = uVar9;
                  lVar34 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x10);
                  iVar96 = auVar100._0_4_;
                  *(int *)(lVar34 + lVar24) = iVar96;
                  lVar34 = lVar34 + lVar24;
                  uVar9 = extractps(auVar100,1);
                  *(undefined8 *)(lVar57 + lVar34) = uVar9;
                  uVar9 = extractps(auVar100,2);
                  *(undefined8 *)(lVar29 + lVar34) = uVar9;
                  uVar9 = extractps(auVar100,3);
                  *(undefined8 *)(lVar28 + lVar34) = uVar9;
                  lVar34 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x18);
                  iVar97 = auVar80._0_4_;
                  *(int *)(lVar34 + lVar24) = iVar97;
                  lVar34 = lVar34 + lVar24;
                  uVar9 = extractps(auVar80,1);
                  *(undefined8 *)(lVar57 + lVar34) = uVar9;
                  uVar9 = extractps(auVar80,2);
                  *(undefined8 *)(lVar29 + lVar34) = uVar9;
                  uVar9 = extractps(auVar80,3);
                  *(undefined8 *)(lVar28 + lVar34) = uVar9;
                  lVar34 = *((ppVar17->field_4).trace)->trace_del_table;
                  *(uint *)(lVar34 + lVar24) = uVar48;
                  lVar34 = lVar34 + lVar24;
                  *(uint *)(lVar57 + lVar34) = uVar53;
                  *(uint *)(lVar29 + lVar34) = uVar55;
                  *(uint *)(lVar28 + lVar34) = uVar58;
                  local_1e8 = ((int)uVar48 < (int)local_1e8) * uVar48 |
                              ((int)uVar48 >= (int)local_1e8) * local_1e8;
                  uStack_1e4 = ((int)uVar53 < (int)uStack_1e4) * uVar53 |
                               ((int)uVar53 >= (int)uStack_1e4) * uStack_1e4;
                  uStack_1e0 = ((int)uVar55 < (int)uStack_1e0) * uVar55 |
                               ((int)uVar55 >= (int)uStack_1e0) * uStack_1e0;
                  uStack_1dc = ((int)uVar58 < (int)uStack_1dc) * uVar58 |
                               ((int)uVar58 >= (int)uStack_1dc) * uStack_1dc;
                  iVar15 = auVar86._0_4_;
                  uVar61 = (iVar15 < (int)uVar48) * uVar48 | (uint)(iVar15 >= (int)uVar48) * iVar15;
                  iVar15 = auVar86._4_4_;
                  uVar69 = (iVar15 < (int)uVar53) * uVar53 | (uint)(iVar15 >= (int)uVar53) * iVar15;
                  iVar15 = auVar86._8_4_;
                  iVar94 = auVar86._12_4_;
                  uVar73 = (iVar15 < (int)uVar55) * uVar55 | (uint)(iVar15 >= (int)uVar55) * iVar15;
                  uVar78 = (iVar94 < (int)uVar58) * uVar58 | (uint)(iVar94 >= (int)uVar58) * iVar94;
                  uVar67 = (uint)(iVar96 < iVar97) * iVar97 | (uint)(iVar96 >= iVar97) * iVar96;
                  iVar15 = auVar80._4_4_;
                  iVar94 = auVar100._4_4_;
                  uVar71 = (uint)(iVar94 < iVar15) * iVar15 | (uint)(iVar94 >= iVar15) * iVar94;
                  iVar94 = auVar80._8_4_;
                  iVar96 = auVar100._8_4_;
                  iVar49 = auVar100._12_4_;
                  uVar77 = (uint)(iVar96 < iVar94) * iVar94 | (uint)(iVar96 >= iVar94) * iVar96;
                  iVar96 = auVar80._12_4_;
                  uVar79 = (uint)(iVar49 < iVar96) * iVar96 | (uint)(iVar49 >= iVar96) * iVar49;
                  iVar49 = uVar48 - open;
                  iVar54 = uVar53 - open;
                  iVar56 = uVar55 - open;
                  iVar59 = uVar58 - open;
                  iVar110 = iVar110 - gap;
                  iVar111 = iVar111 - gap;
                  iVar112 = iVar112 - gap;
                  iVar113 = iVar113 - gap;
                  auVar43._0_4_ = -(uint)(iVar110 < iVar49);
                  auVar43._4_4_ = -(uint)(iVar111 < iVar54);
                  auVar43._8_4_ = -(uint)(iVar112 < iVar56);
                  auVar43._12_4_ = -(uint)(iVar113 < iVar59);
                  auVar80 = blendvps(auVar63,auVar109,auVar43);
                  auVar85 = blendvps(auVar85,auVar100,auVar43);
                  auVar89._0_4_ = auVar90._0_4_ + 1;
                  auVar89._4_4_ = auVar90._4_4_ + 1;
                  auVar89._8_4_ = auVar90._8_4_ + 1;
                  auVar89._12_4_ = auVar90._12_4_ + 1;
                  auVar104._0_4_ = iVar97 + 1;
                  auVar104._4_4_ = iVar15 + 1;
                  auVar104._8_4_ = iVar94 + 1;
                  auVar104._12_4_ = iVar96 + 1;
                  auVar63 = blendvps(auVar89,auVar104,auVar43);
                  iVar94 = uVar62 - gap;
                  iVar96 = uVar68 - gap;
                  iVar97 = uVar70 - gap;
                  iVar98 = uVar72 - gap;
                  auVar50._0_4_ = -(uint)(iVar94 < iVar49);
                  auVar50._4_4_ = -(uint)(iVar96 < iVar54);
                  auVar50._8_4_ = -(uint)(iVar97 < iVar56);
                  auVar50._12_4_ = -(uint)(iVar98 < iVar59);
                  auVar93 = blendvps(auVar93,auVar109,auVar50);
                  local_1d8 = blendvps(local_1d8,auVar100,auVar50);
                  uVar62 = (uint)((int)uVar61 < iVar108) * iVar108 |
                           ((int)uVar61 >= iVar108) * uVar61;
                  iVar15 = auVar109._4_4_;
                  uVar68 = (uint)((int)uVar69 < iVar15) * iVar15 | ((int)uVar69 >= iVar15) * uVar69;
                  iVar15 = auVar109._8_4_;
                  uVar70 = (uint)((int)uVar73 < iVar15) * iVar15 | ((int)uVar73 >= iVar15) * uVar73;
                  iVar15 = auVar109._12_4_;
                  uVar72 = (uint)((int)uVar78 < iVar15) * iVar15 | ((int)uVar78 >= iVar15) * uVar78;
                  auVar86._0_4_ =
                       ((int)uVar67 < (int)uVar62) * uVar62 | ((int)uVar67 >= (int)uVar62) * uVar67;
                  auVar86._4_4_ =
                       ((int)uVar71 < (int)uVar68) * uVar68 | ((int)uVar71 >= (int)uVar68) * uVar71;
                  auVar86._8_4_ =
                       ((int)uVar77 < (int)uVar70) * uVar70 | ((int)uVar77 >= (int)uVar70) * uVar77;
                  auVar86._12_4_ =
                       ((int)uVar79 < (int)uVar72) * uVar72 | ((int)uVar79 >= (int)uVar72) * uVar79;
                  puVar3 = (uint *)((long)*ptr_03 + lVar32);
                  *puVar3 = (uint)(iVar49 < iVar110) * iVar110 | (uint)(iVar49 >= iVar110) * iVar49;
                  puVar3[1] = (uint)(iVar54 < iVar111) * iVar111 |
                              (uint)(iVar54 >= iVar111) * iVar54;
                  puVar3[2] = (uint)(iVar56 < iVar112) * iVar112 |
                              (uint)(iVar56 >= iVar112) * iVar56;
                  puVar3[3] = (uint)(iVar59 < iVar113) * iVar113 |
                              (uint)(iVar59 >= iVar113) * iVar59;
                  *(undefined1 (*) [16])((long)*b_01 + lVar32) = auVar80;
                  *(undefined1 (*) [16])((long)*b_02 + lVar32) = auVar85;
                  *(undefined1 (*) [16])((long)*b_03 + lVar32) = auVar63;
                  auVar81._0_4_ = auVar82._0_4_ + 1;
                  auVar81._4_4_ = auVar82._4_4_ + 1;
                  auVar81._8_4_ = auVar82._8_4_ + 1;
                  auVar81._12_4_ = auVar82._12_4_ + 1;
                  auVar82 = blendvps(auVar81,auVar104,auVar50);
                  uVar62 = (uint)(iVar49 < iVar94) * iVar94 | (uint)(iVar49 >= iVar94) * iVar49;
                  uVar68 = (uint)(iVar54 < iVar96) * iVar96 | (uint)(iVar54 >= iVar96) * iVar54;
                  uVar70 = (uint)(iVar56 < iVar97) * iVar97 | (uint)(iVar56 >= iVar97) * iVar56;
                  uVar72 = (uint)(iVar59 < iVar98) * iVar98 | (uint)(iVar59 >= iVar98) * iVar59;
                  piVar2 = (int *)((long)*ptr + lVar32);
                  iVar60 = *piVar2;
                  iVar15 = piVar2[1];
                  iVar94 = piVar2[2];
                  iVar96 = piVar2[3];
                  piVar2 = (int *)((long)*ptr_00 + lVar32);
                  iVar97 = *piVar2;
                  iVar98 = piVar2[1];
                  iVar108 = piVar2[2];
                  iVar101 = piVar2[3];
                  piVar2 = (int *)((long)*ptr_01 + lVar32);
                  iVar102 = *piVar2;
                  iVar105 = piVar2[1];
                  iVar106 = piVar2[2];
                  iVar107 = piVar2[3];
                  piVar2 = (int *)((long)*ptr_02 + lVar32);
                  iVar49 = *piVar2;
                  iVar54 = piVar2[1];
                  iVar56 = piVar2[2];
                  iVar59 = piVar2[3];
                  lVar32 = lVar32 + 0x10;
                  lVar24 = lVar24 + uVar47 * 4;
                } while (uVar33 << 4 != lVar32);
                iVar15 = 0;
                do {
                  iVar94 = (int)(*palVar18)[0];
                  iVar96 = *(int *)((long)*palVar18 + 4);
                  iVar49 = (int)(*palVar18)[1];
                  uVar72 = uVar30;
                  if (s2_beg == 0) {
                    uVar72 = ptr_04[uVar20 + 1] - open;
                  }
                  iVar60 = ptr_04[uVar20];
                  auVar83._0_4_ = auVar82._0_4_;
                  auVar83._4_4_ = auVar83._0_4_;
                  auVar83._8_4_ = auVar82._4_4_;
                  auVar83._12_4_ = auVar82._8_4_;
                  auVar82._8_8_ = auVar83._8_8_;
                  auVar82._0_8_ = (ulong)auVar83._0_4_ << 0x20 | 1;
                  lVar24 = auVar93._8_8_;
                  uVar92 = auVar93._0_8_;
                  auVar93._0_8_ = uVar92 << 0x20;
                  auVar93._8_8_ = lVar24 << 0x20 | uVar92 >> 0x20;
                  lVar24 = local_1d8._8_8_;
                  uVar92 = local_1d8._0_8_;
                  local_1d8._0_8_ = uVar92 << 0x20;
                  local_1d8._8_8_ = lVar24 << 0x20 | uVar92 >> 0x20;
                  lVar32 = 0;
                  lVar24 = lVar25;
                  uVar48 = uVar62;
                  uVar53 = uVar68;
                  uVar55 = uVar70;
                  do {
                    piVar2 = (int *)((long)pvVar5 + lVar32 + lVar26);
                    iVar54 = *piVar2;
                    iVar56 = piVar2[1];
                    iVar59 = piVar2[2];
                    iVar97 = piVar2[3];
                    piVar2 = (int *)((long)*local_230 + lVar32);
                    iVar98 = *piVar2;
                    iVar108 = piVar2[1];
                    iVar101 = piVar2[2];
                    iVar102 = piVar2[3];
                    uVar61 = (iVar98 < (int)uVar72) * uVar72 |
                             (uint)(iVar98 >= (int)uVar72) * iVar98;
                    uVar67 = (iVar108 < (int)uVar48) * uVar48 |
                             (uint)(iVar108 >= (int)uVar48) * iVar108;
                    uVar69 = (iVar101 < (int)uVar53) * uVar53 |
                             (uint)(iVar101 >= (int)uVar53) * iVar101;
                    uVar71 = (iVar102 < (int)uVar55) * uVar55 |
                             (uint)(iVar102 >= (int)uVar55) * iVar102;
                    puVar3 = (uint *)((long)*local_230 + lVar32);
                    *puVar3 = uVar61;
                    puVar3[1] = uVar67;
                    puVar3[2] = uVar69;
                    puVar3[3] = uVar71;
                    auVar65._0_4_ = -(uint)(iVar60 + iVar54 == uVar61);
                    auVar65._4_4_ = -(uint)(iVar94 + iVar56 == uVar67);
                    auVar65._8_4_ = -(uint)(iVar96 + iVar59 == uVar69);
                    auVar65._12_4_ = -(uint)(iVar49 + iVar97 == uVar71);
                    auVar44._0_4_ = -(uint)((int)uVar72 < iVar98);
                    auVar44._4_4_ = -(uint)((int)uVar48 < iVar108);
                    auVar44._8_4_ = -(uint)((int)uVar53 < iVar101);
                    auVar44._12_4_ = -(uint)((int)uVar55 < iVar102);
                    auVar44 = auVar44 | auVar65;
                    auVar63 = blendvps(auVar93,*(undefined1 (*) [16])((long)*local_208 + lVar32),
                                       auVar44);
                    *(undefined1 (*) [16])((long)*local_208 + lVar32) = auVar63;
                    auVar85 = blendvps(local_1d8,*(undefined1 (*) [16])((long)*local_218 + lVar32),
                                       auVar44);
                    *(undefined1 (*) [16])((long)*local_218 + lVar32) = auVar85;
                    auVar90 = blendvps(auVar82,*(undefined1 (*) [16])((long)*local_210 + lVar32),
                                       auVar44);
                    *(undefined1 (*) [16])((long)*local_210 + lVar32) = auVar90;
                    lVar34 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 8);
                    iVar94 = auVar63._0_4_;
                    *(int *)(lVar34 + lVar24) = iVar94;
                    lVar34 = lVar34 + lVar24;
                    uVar9 = extractps(auVar63,1);
                    *(undefined8 *)(lVar57 + lVar34) = uVar9;
                    uVar9 = extractps(auVar63,2);
                    *(undefined8 *)(lVar29 + lVar34) = uVar9;
                    uVar9 = extractps(auVar63,3);
                    *(undefined8 *)(lVar28 + lVar34) = uVar9;
                    lVar34 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x10);
                    iVar96 = auVar85._0_4_;
                    *(int *)(lVar34 + lVar24) = iVar96;
                    lVar34 = lVar34 + lVar24;
                    uVar9 = extractps(auVar85,1);
                    *(undefined8 *)(lVar57 + lVar34) = uVar9;
                    uVar9 = extractps(auVar85,2);
                    *(undefined8 *)(lVar29 + lVar34) = uVar9;
                    uVar9 = extractps(auVar85,3);
                    *(undefined8 *)(lVar28 + lVar34) = uVar9;
                    local_1e8 = ((int)uVar61 < (int)local_1e8) * uVar61 |
                                ((int)uVar61 >= (int)local_1e8) * local_1e8;
                    uStack_1e4 = ((int)uVar67 < (int)uStack_1e4) * uVar67 |
                                 ((int)uVar67 >= (int)uStack_1e4) * uStack_1e4;
                    uStack_1e0 = ((int)uVar69 < (int)uStack_1e0) * uVar69 |
                                 ((int)uVar69 >= (int)uStack_1e0) * uStack_1e0;
                    uStack_1dc = ((int)uVar71 < (int)uStack_1dc) * uVar71 |
                                 ((int)uVar71 >= (int)uStack_1dc) * uStack_1dc;
                    lVar34 = *(long *)((long)((ppVar17->field_4).trace)->trace_del_table + 0x18);
                    iVar56 = auVar90._0_4_;
                    *(int *)(lVar34 + lVar24) = iVar56;
                    lVar34 = lVar34 + lVar24;
                    uVar9 = extractps(auVar90,1);
                    *(undefined8 *)(lVar57 + lVar34) = uVar9;
                    uVar9 = extractps(auVar90,2);
                    *(undefined8 *)(lVar29 + lVar34) = uVar9;
                    uVar9 = extractps(auVar90,3);
                    *(undefined8 *)(lVar28 + lVar34) = uVar9;
                    iVar49 = auVar86._0_4_;
                    uVar62 = (iVar49 < (int)uVar61) * uVar61 |
                             (uint)(iVar49 >= (int)uVar61) * iVar49;
                    iVar49 = auVar86._4_4_;
                    uVar68 = (iVar49 < (int)uVar67) * uVar67 |
                             (uint)(iVar49 >= (int)uVar67) * iVar49;
                    iVar49 = auVar86._8_4_;
                    iVar54 = auVar86._12_4_;
                    uVar70 = (iVar49 < (int)uVar69) * uVar69 |
                             (uint)(iVar49 >= (int)uVar69) * iVar49;
                    uVar58 = (iVar54 < (int)uVar71) * uVar71 |
                             (uint)(iVar54 >= (int)uVar71) * iVar54;
                    uVar62 = (uint)((int)uVar62 < iVar94) * iVar94 |
                             ((int)uVar62 >= iVar94) * uVar62;
                    iVar94 = auVar63._4_4_;
                    uVar68 = (uint)((int)uVar68 < iVar94) * iVar94 |
                             ((int)uVar68 >= iVar94) * uVar68;
                    iVar94 = auVar63._8_4_;
                    uVar70 = (uint)((int)uVar70 < iVar94) * iVar94 |
                             ((int)uVar70 >= iVar94) * uVar70;
                    iVar94 = auVar63._12_4_;
                    uVar58 = (uint)((int)uVar58 < iVar94) * iVar94 |
                             ((int)uVar58 >= iVar94) * uVar58;
                    lVar34 = *((ppVar17->field_4).trace)->trace_del_table;
                    *(uint *)(lVar34 + lVar24) = uVar61;
                    lVar34 = lVar34 + lVar24;
                    *(uint *)(lVar57 + lVar34) = uVar67;
                    *(uint *)(lVar29 + lVar34) = uVar69;
                    *(uint *)(lVar28 + lVar34) = uVar71;
                    iVar49 = auVar85._4_4_;
                    iVar54 = auVar85._12_4_;
                    uVar73 = (uint)(iVar96 < iVar56) * iVar56 | (uint)(iVar96 >= iVar56) * iVar96;
                    iVar94 = auVar90._4_4_;
                    uVar77 = (uint)(iVar49 < iVar94) * iVar94 | (uint)(iVar49 >= iVar94) * iVar49;
                    iVar94 = auVar90._8_4_;
                    iVar96 = auVar85._8_4_;
                    uVar78 = (uint)(iVar96 < iVar94) * iVar94 | (uint)(iVar96 >= iVar94) * iVar96;
                    iVar94 = auVar90._12_4_;
                    uVar79 = (uint)(iVar54 < iVar94) * iVar94 | (uint)(iVar54 >= iVar94) * iVar54;
                    auVar86._0_4_ =
                         ((int)uVar73 < (int)uVar62) * uVar62 |
                         ((int)uVar73 >= (int)uVar62) * uVar73;
                    auVar86._4_4_ =
                         ((int)uVar77 < (int)uVar68) * uVar68 |
                         ((int)uVar77 >= (int)uVar68) * uVar77;
                    auVar86._8_4_ =
                         ((int)uVar78 < (int)uVar70) * uVar70 |
                         ((int)uVar78 >= (int)uVar70) * uVar78;
                    auVar86._12_4_ =
                         ((int)uVar79 < (int)uVar58) * uVar58 |
                         ((int)uVar79 >= (int)uVar58) * uVar79;
                    uVar62 = uVar72 - gap;
                    uVar68 = uVar48 - gap;
                    uVar70 = uVar53 - gap;
                    uVar55 = uVar55 - gap;
                    auVar51._0_4_ = -(uint)((int)uVar62 < (int)(uVar61 - open));
                    auVar51._4_4_ = -(uint)((int)uVar68 < (int)(uVar67 - open));
                    auVar51._8_4_ = -(uint)((int)uVar70 < (int)(uVar69 - open));
                    auVar51._12_4_ = -(uint)((int)uVar55 < (int)(uVar71 - open));
                    iVar94 = movmskps((int)lVar34,auVar51);
                    if (iVar94 == 0xf) goto LAB_006f1443;
                    auVar93 = blendvps(auVar93,auVar63,auVar51);
                    local_1d8 = blendvps(local_1d8,auVar85,auVar51);
                    auVar63 = blendvps(auVar82,auVar90,auVar51);
                    auVar82._0_4_ = auVar63._0_4_ + 1;
                    auVar82._4_4_ = auVar63._4_4_ + 1;
                    auVar82._8_4_ = auVar63._8_4_ + 1;
                    auVar82._12_4_ = auVar63._12_4_ + 1;
                    piVar2 = (int *)((long)*ptr + lVar32);
                    iVar60 = *piVar2;
                    iVar94 = piVar2[1];
                    iVar96 = piVar2[2];
                    iVar49 = piVar2[3];
                    lVar32 = lVar32 + 0x10;
                    lVar24 = lVar24 + uVar47 * 4;
                    uVar72 = uVar62;
                    uVar48 = uVar68;
                    uVar53 = uVar70;
                  } while (uVar33 << 4 != lVar32);
                  iVar15 = iVar15 + 1;
                } while (iVar15 != 4);
LAB_006f1443:
                palVar18 = local_230 + uVar36;
                iVar94 = (int)(*palVar18)[0];
                iVar96 = *(int *)((long)*palVar18 + 4);
                iVar49 = (int)(*palVar18)[1];
                iVar54 = *(int *)((long)*palVar18 + 0xc);
                local_78 = auVar52._0_4_;
                iStack_74 = auVar52._4_4_;
                iStack_70 = auVar52._8_4_;
                iStack_6c = auVar52._12_4_;
                auVar45._0_4_ = -(uint)(local_78 < iVar94);
                auVar45._4_4_ = -(uint)(iStack_74 < iVar96);
                auVar45._8_4_ = -(uint)(iStack_70 < iVar49);
                auVar45._12_4_ = -(uint)(iStack_6c < iVar54);
                auVar84 = blendvps(auVar84,(undefined1  [16])local_208[uVar36],auVar45);
                auVar76 = blendvps(auVar76,(undefined1  [16])local_218[uVar36],auVar45);
                auVar37 = blendvps(auVar37,(undefined1  [16])local_210[uVar36],auVar45);
                iVar15 = auVar37._12_4_;
                auVar11._4_4_ = -(uint)(uVar21 == 2);
                auVar11._0_4_ = -(uint)(uVar21 == 3);
                auVar11._8_4_ = -(uint)(uVar21 == 1);
                auVar11._12_4_ = -(uint)(uVar21 == 0);
                iVar56 = movmskps((int)uVar36 * 0x10,auVar45 & auVar11);
                if (iVar56 != 0) {
                  local_244 = (int)uVar20;
                }
                auVar52._0_4_ =
                     (uint)(iVar94 < local_78) * local_78 | (uint)(iVar94 >= local_78) * iVar94;
                auVar52._4_4_ =
                     (uint)(iVar96 < iStack_74) * iStack_74 | (uint)(iVar96 >= iStack_74) * iVar96;
                auVar52._8_4_ =
                     (uint)(iVar49 < iStack_70) * iStack_70 | (uint)(iVar49 >= iStack_70) * iVar49;
                auVar52._12_4_ =
                     (uint)(iVar54 < iStack_6c) * iStack_6c | (uint)(iVar54 >= iStack_6c) * iVar54;
                uVar20 = uVar20 + 1;
                lVar25 = lVar25 + 4;
                palVar18 = local_230;
                palVar19 = local_210;
                b = local_208;
                b_00 = local_218;
                if (uVar20 == uVar47) {
                  if (s2_end == 0) {
                    iVar94 = 0;
                    iVar96 = 0;
                    iVar15 = 0;
                    local_248 = uVar14;
                  }
                  else {
                    if (iVar16 < 3) {
                      iVar94 = 0;
                      do {
                        lVar57 = auVar52._8_8_;
                        uVar33 = auVar52._0_8_;
                        auVar52._0_8_ = uVar33 << 0x20;
                        auVar52._8_8_ = lVar57 << 0x20 | uVar33 >> 0x20;
                        lVar57 = auVar84._8_8_;
                        uVar33 = auVar84._0_8_;
                        auVar84._0_8_ = uVar33 << 0x20;
                        auVar84._8_8_ = lVar57 << 0x20 | uVar33 >> 0x20;
                        lVar57 = auVar76._8_8_;
                        uVar33 = auVar76._0_8_;
                        auVar76._0_8_ = uVar33 << 0x20;
                        auVar76._8_8_ = lVar57 << 0x20 | uVar33 >> 0x20;
                        auVar66._0_8_ = auVar37._0_8_ << 0x20;
                        auVar66._8_8_ = auVar37._8_8_ << 0x20 | auVar37._0_8_ >> 0x20;
                        iVar15 = auVar37._8_4_;
                        iVar94 = iVar94 + 1;
                        auVar37 = auVar66;
                      } while (iVar94 < (int)uVar21);
                    }
                    iVar94 = (int)(auVar84._8_8_ >> 0x20);
                    iVar96 = (int)(auVar76._8_8_ >> 0x20);
                    local_248 = (uint)(auVar52._8_8_ >> 0x20);
                  }
                  uVar30 = uVar12;
                  if ((s1_end != 0) && ((uVar31 & 0x7ffffffc) != 0)) {
                    uVar31 = 0;
                    do {
                      uVar27 = ((uint)uVar31 & 3) * uVar35 + ((uint)(uVar31 >> 2) & 0x3fffffff);
                      if ((int)uVar27 < (int)uVar4) {
                        uVar62 = *(uint *)((long)*local_230 + uVar31 * 4);
                        if (((int)local_248 < (int)uVar62) ||
                           (((uVar62 == local_248 && (local_244 == iVar1)) &&
                            (uVar62 = local_248, (int)uVar27 < (int)uVar30)))) {
                          iVar94 = *(int *)((long)*local_208 + uVar31 * 4);
                          iVar96 = *(int *)((long)*local_218 + uVar31 * 4);
                          iVar15 = *(int *)((long)*local_210 + uVar31 * 4);
                          local_248 = uVar62;
                          local_244 = iVar1;
                          uVar30 = uVar27;
                        }
                      }
                      uVar31 = uVar31 + 1;
                    } while ((uVar35 & 0x1fffffff) << 2 != (int)uVar31);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar31 = local_230[uVar36][1];
                    uVar33 = local_208[uVar36][1];
                    uVar20 = local_218[uVar36][1];
                    uVar47 = local_210[uVar36][1];
                    if (iVar16 < 3) {
                      iVar16 = 0;
                      auVar52._8_8_ = local_230[uVar36][0];
                      auVar76._8_8_ = local_208[uVar36][0];
                      auVar84._8_8_ = local_218[uVar36][0];
                      uVar36 = local_210[uVar36][0];
                      do {
                        uVar31 = uVar31 << 0x20 | auVar52._8_8_ >> 0x20;
                        uVar33 = uVar33 << 0x20 | auVar76._8_8_ >> 0x20;
                        uVar20 = uVar20 << 0x20 | auVar84._8_8_ >> 0x20;
                        uVar47 = uVar47 << 0x20 | uVar36 >> 0x20;
                        iVar16 = iVar16 + 1;
                        auVar52._8_8_ = auVar52._8_8_ << 0x20;
                        auVar76._8_8_ = auVar76._8_8_ << 0x20;
                        auVar84._8_8_ = auVar84._8_8_ << 0x20;
                        uVar36 = uVar36 << 0x20;
                      } while (iVar16 < (int)uVar21);
                    }
                    local_248 = (uint)(uVar31 >> 0x20);
                    iVar94 = (int)(uVar33 >> 0x20);
                    iVar96 = (int)(uVar20 >> 0x20);
                    iVar15 = (int)(uVar47 >> 0x20);
                    uVar30 = uVar12;
                    local_244 = iVar1;
                  }
                  auVar46._0_4_ = -(uint)((int)local_1e8 < (int)uVar14);
                  auVar46._4_4_ = -(uint)((int)uStack_1e4 < (int)uVar14);
                  auVar46._8_4_ = -(uint)((int)uStack_1e0 < (int)uVar14);
                  auVar46._12_4_ = -(uint)((int)uStack_1dc < (int)uVar14);
                  auVar87._0_4_ = -(uint)((int)uVar13 < (int)auVar86._0_4_);
                  auVar87._4_4_ = -(uint)((int)uVar13 < (int)auVar86._4_4_);
                  auVar87._8_4_ = -(uint)((int)uVar13 < (int)auVar86._8_4_);
                  auVar87._12_4_ = -(uint)((int)uVar13 < (int)auVar86._12_4_);
                  iVar16 = movmskps(s1_end,auVar87 | auVar46);
                  if (iVar16 != 0) {
                    *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                    local_248 = 0;
                    iVar94 = 0;
                    iVar96 = 0;
                    iVar15 = 0;
                    local_244 = 0;
                    uVar30 = 0;
                  }
                  ppVar17->score = local_248;
                  ppVar17->end_query = uVar30;
                  ppVar17->end_ref = local_244;
                  ((ppVar17->field_4).stats)->matches = iVar94;
                  ((ppVar17->field_4).stats)->similar = iVar96;
                  ((ppVar17->field_4).stats)->length = iVar15;
                  parasail_free(ptr_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(b_01);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(local_210);
                  parasail_free(ptr_01);
                  parasail_free(local_218);
                  parasail_free(ptr_00);
                  parasail_free(local_208);
                  parasail_free(ptr);
                  parasail_free(local_230);
                  return ppVar17;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi32(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
        result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
            vMaxHM = _mm_slli_si128(vMaxHM, 4);
            vMaxHS = _mm_slli_si128(vMaxHS, 4);
            vMaxHL = _mm_slli_si128(vMaxHL, 4);
        }
        end_query = s1Len-1;
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        matches = (int32_t) _mm_extract_epi32(vMaxHM, 3);
        similar = (int32_t) _mm_extract_epi32(vMaxHS, 3);
        length = (int32_t) _mm_extract_epi32(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t *m = (int32_t*)pvHMStore;
        int32_t *s = (int32_t*)pvHSStore;
        int32_t *l = (int32_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}